

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_code(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  uchar *inBuf;
  Value local_78;
  Value local_68;
  unsigned_long local_58;
  long codepoint;
  String local_40;
  undefined1 local_30 [8];
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  self.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"self");
  Context::GetVar((Context *)local_30,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  local_58 = 0;
  bVar1 = Value::IsNull((Value *)local_30);
  if (!bVar1) {
    Value::ToString(&local_68,(Machine *)local_30);
    inBuf = (uchar *)String::c_str((String *)&local_68);
    local_58 = UTF8Decode(inBuf);
    String::~String((String *)&local_68);
  }
  Value::Value(&local_78,(double)(long)local_58);
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_78,true);
  Value::~Value(&local_78);
  Value::~Value((Value *)local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_code(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		long codepoint = 0;
		if (not self.IsNull()) codepoint = UTF8Decode((unsigned char*)(self.ToString().c_str()));
		return IntrinsicResult(codepoint);
	}